

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O0

void __thiscall Interface::SetOption(Interface *this,string *sParams)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  ostream *poVar4;
  ulong uVar5;
  allocator local_3c1;
  string local_3c0 [32];
  string local_3a0 [32];
  stringstream local_380 [8];
  stringstream sfail;
  ostream local_370 [392];
  ulong local_1e8;
  size_t nValue;
  string sName;
  string local_1c0 [8];
  string sParam;
  stringstream local_1a0 [8];
  stringstream ss;
  string *sParams_local;
  Interface *this_local;
  
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1a0,(string *)sParams,_Var2);
  std::__cxx11::string::string(local_1c0);
  std::__cxx11::string::string((string *)&nValue);
  local_1e8 = 1;
  while( true ) {
    piVar3 = std::operator>>((istream *)local_1a0,local_1c0);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1c0,"name");
    if (bVar1) {
      std::operator>>((istream *)local_1a0,(string *)&nValue);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1c0,"value");
      if (bVar1) {
        std::istream::operator>>(local_1a0,&local_1e8);
      }
      else {
        std::__cxx11::stringstream::stringstream(local_380);
        poVar4 = std::operator<<(local_370,"Unrecognized SetOption parameter: ");
        std::operator<<(poVar4,local_1c0);
        std::__cxx11::stringstream::str();
        Notify(this,local_3a0);
        std::__cxx11::string::~string((string *)local_3a0);
        std::__cxx11::stringstream::~stringstream(local_380);
      }
    }
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &nValue,"Hash");
    if (bVar1) {
      (*s_pPositionHashTable->_vptr_PositionHashTable[6])(s_pPositionHashTable,local_1e8 << 0x14);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_3c0,"SetOption: Could not find name of the option to set",&local_3c1);
    Notify(this,(string *)local_3c0);
    std::__cxx11::string::~string(local_3c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  }
  std::__cxx11::string::~string((string *)&nValue);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

INTERFACE_PROTOTYPE( SetOption )
    {
        stringstream ss( sParams );
        string sParam, sName;
        size_t nValue = 1;

        while ( ss >> sParam )
        {
            if ( sParam == "name" )
                ss >> sName;
            else if ( sParam == "value" )
                ss >> nValue;
            else
            {
                stringstream sfail;
                sfail << "Unrecognized SetOption parameter: " << sParam;
                Notify( sfail.str() );
            }
        }

        if ( !sName.empty() )
        {
            if ( sName == "Hash" )
                s_pPositionHashTable->SetSize( nValue * 1024 * 1024 );
        }
        else
            Notify( "SetOption: Could not find name of the option to set" );
    }